

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::BDPTIntegrator::Li
          (BDPTIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *param_5)

{
  pointer pFVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Array path;
  Point2<float> *pPVar5;
  byte bVar6;
  int t;
  int iVar7;
  int s;
  long lVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar14 [56];
  undefined1 auVar13 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar18 [56];
  undefined1 auVar17 [64];
  SampledSpectrum SVar19;
  Float misWeight;
  optional<pbrt::Point2<float>_> pFilmNew;
  SampledSpectrum Lpath;
  SampledSpectrum local_c8;
  Array local_b8;
  Array local_b0;
  SamplerHandle *local_a8;
  uintptr_t local_a0;
  uintptr_t local_98;
  uintptr_t local_90;
  SampledSpectrum L;
  uintptr_t local_58;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_50;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_48;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_40;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_38;
  
  path = ScratchBuffer::Alloc<pbrt::Vertex[]>(scratchBuffer,(long)this->maxDepth + 2);
  local_38.bits =
       (sampler->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  local_40.bits =
       (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
       .bits;
  uVar3 = GenerateCameraSubpath
                    ((Integrator *)this,ray,lambda,(SamplerHandle *)&local_38,scratchBuffer,
                     this->maxDepth + 2,(CameraHandle *)&local_40,path,this->regularize);
  local_b8 = ScratchBuffer::Alloc<pbrt::Vertex[]>(scratchBuffer,(long)this->maxDepth + 1);
  local_48.bits =
       (sampler->
       super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  local_50.bits =
       (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
       .bits;
  local_58 = (this->lightSampler).
             super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
             .bits;
  local_b0 = path;
  local_a8 = sampler;
  iVar4 = GenerateLightSubpath
                    ((Integrator *)this,lambda,(SamplerHandle *)&local_48,(CameraHandle *)&local_50,
                     scratchBuffer,this->maxDepth + 1,(path->field_2).ei.super_Interaction.time,
                     (LightSamplerHandle)&local_58,local_b8,this->regularize);
  auVar12 = ZEXT1664(ZEXT816(0) << 0x40);
  SampledSpectrum::SampledSpectrum(&L,0.0);
  t = 1;
  iVar7 = 0;
  do {
    if (t == (~((int)uVar3 >> 0x1f) & uVar3) + 1) {
      return (SampledSpectrum)L.values;
    }
    lVar8 = 0;
    while( true ) {
      auVar18 = in_ZMM1._8_56_;
      auVar14 = auVar12._8_56_;
      s = (int)lVar8;
      if (iVar4 < s) break;
      if (((s != 1 || t != 1) && (1 < (uint)(iVar7 + 1 + s))) &&
         (iVar9 = iVar7 + -1 + s, iVar9 <= this->maxDepth)) {
        pFilmNew.set = false;
        misWeight = 0.0;
        local_90 = (this->lightSampler).
                   super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                   .bits;
        local_98 = (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
                   super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                   .bits;
        local_a0 = (local_a8->
                   super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   ).bits;
        SVar19 = ConnectBDPT((Integrator *)this,lambda,local_b8,local_b0,s,t,
                             (LightSamplerHandle)&local_90,(CameraHandle)&local_98,
                             (SamplerHandle)&local_a0,&pFilmNew,&misWeight);
        in_ZMM1._0_8_ = SVar19.values.values._8_8_;
        in_ZMM1._8_56_ = auVar18;
        auVar12._0_8_ = SVar19.values.values._0_8_;
        auVar12._8_56_ = auVar14;
        auVar10 = auVar12._0_16_;
        auVar15 = in_ZMM1._0_16_;
        Lpath.values.values = (array<float,_4>)vmovlhps_avx(auVar10,auVar15);
        auVar12 = ZEXT1664((undefined1  [16])Lpath.values.values);
        if (pFilmNew.set == true) {
          if (this->visualizeStrategies == false) {
            if (this->visualizeWeights == false) goto LAB_003d630a;
            auVar16 = ZEXT816(0) << 0x40;
            bVar6 = 1;
            auVar11 = SUB6416(ZEXT864(0),0) << 0x20;
          }
          else {
            auVar14 = (undefined1  [56])0x0;
            if ((misWeight != 0.0) || (NAN(misWeight))) {
              SVar19 = SampledSpectrum::operator/(&Lpath,misWeight);
              auVar17._0_8_ = SVar19.values.values._8_8_;
              auVar17._8_56_ = auVar18;
              auVar16 = auVar17._0_16_;
              auVar13._0_8_ = SVar19.values.values._0_8_;
              auVar13._8_56_ = auVar14;
              auVar11 = auVar13._0_16_;
            }
            else {
              SampledSpectrum::SampledSpectrum(&local_c8,0.0);
              auVar11._8_8_ = 0;
              auVar11._0_4_ = local_c8.values.values[0];
              auVar11._4_4_ = local_c8.values.values[1];
              auVar16._8_8_ = 0;
              auVar16._0_4_ = local_c8.values.values[2];
              auVar16._4_4_ = local_c8.values.values[3];
            }
            SVar19.values.values = Lpath.values.values;
            auVar10._8_8_ = 0;
            auVar10._0_4_ = Lpath.values.values[0];
            auVar10._4_4_ = Lpath.values.values[1];
            Lpath.values.values._8_8_ = SVar19.values.values._8_8_;
            auVar15._8_8_ = 0;
            auVar15._0_4_ = Lpath.values.values[2];
            auVar15._4_4_ = Lpath.values.values[3];
            bVar6 = this->visualizeWeights;
            Lpath.values.values = SVar19.values.values;
          }
          if ((bVar6 & 1) == 0) {
            auVar10 = auVar11;
            auVar15 = auVar16;
          }
          if ((pFilmNew.set & 1U) == 0) {
            LogFatal<char_const(&)[21]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
                       ,0x8e0,"Check failed: %s",(char (*) [21])"pFilmNew.has_value()");
          }
          pFVar1 = (this->weightFilms).
                   super__Vector_base<pbrt::FilmHandle,_std::allocator<pbrt::FilmHandle>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pPVar5 = pstd::optional<pbrt::Point2<float>_>::value(&pFilmNew);
          SVar19.values.values._0_8_ = auVar10._0_8_;
          SVar19.values.values._8_8_ = auVar15._0_8_;
          in_ZMM1 = ZEXT1664(auVar15);
          auVar12 = ZEXT1664(auVar10);
          FilmHandle::AddSplat(pFVar1 + (iVar9 * (iVar7 + 4 + s)) / 2 + lVar8,pPVar5,SVar19,lambda);
        }
LAB_003d630a:
        if (t == 1) {
          bVar2 = SampledSpectrum::operator_cast_to_bool(&Lpath);
          if (bVar2) {
            if (pFilmNew.set == false) {
              LogFatal<char_const(&)[21]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators.cpp"
                         ,0x8e6,"Check failed: %s",(char (*) [21])"pFilmNew.has_value()");
            }
            local_c8.values.values._0_8_ =
                 *(ulong *)(((this->super_RayIntegrator).super_ImageTileIntegrator.camera.
                             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                             .bits & 0xffffffffffff) + 0x340);
            pPVar5 = pstd::optional<pbrt::Point2<float>_>::value(&pFilmNew);
            in_ZMM1 = ZEXT864((ulong)Lpath.values.values._8_8_);
            auVar12 = ZEXT864((ulong)Lpath.values.values._0_8_);
            FilmHandle::AddSplat((FilmHandle *)&local_c8,pPVar5,Lpath,lambda);
          }
        }
        else {
          SampledSpectrum::operator+=(&L,&Lpath);
        }
        pstd::optional<pbrt::Point2<float>_>::~optional(&pFilmNew);
      }
      lVar8 = lVar8 + 1;
    }
    t = t + 1;
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

SampledSpectrum BDPTIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                   SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                   VisibleSurface *) const {
    // Trace the camera and light subpaths
    Vertex *cameraVertices = scratchBuffer.Alloc<Vertex[]>(maxDepth + 2);
    int nCamera = GenerateCameraSubpath(*this, ray, lambda, sampler, scratchBuffer,
                                        maxDepth + 2, camera, cameraVertices, regularize);
    Vertex *lightVertices = scratchBuffer.Alloc<Vertex[]>(maxDepth + 1);
    int nLight = GenerateLightSubpath(*this, lambda, sampler, camera, scratchBuffer,
                                      maxDepth + 1, cameraVertices[0].time(),
                                      lightSampler, lightVertices, regularize);

    SampledSpectrum L(0.f);
    // Execute all BDPT connection strategies
    for (int t = 1; t <= nCamera; ++t) {
        for (int s = 0; s <= nLight; ++s) {
            int depth = t + s - 2;
            if ((s == 1 && t == 1) || depth < 0 || depth > maxDepth)
                continue;
            // Execute the $(s, t)$ connection strategy and update _L_
            pstd::optional<Point2f> pFilmNew;
            Float misWeight = 0.f;
            SampledSpectrum Lpath =
                ConnectBDPT(*this, lambda, lightVertices, cameraVertices, s, t,
                            lightSampler, camera, sampler, &pFilmNew, &misWeight);
            PBRT_DBG("%s\n",
                     StringPrintf("Connect bdpt s: %d, t: %d, Lpath: %s, misWeight: %f\n",
                                  s, t, Lpath, misWeight)
                         .c_str());
            if (pFilmNew && (visualizeStrategies || visualizeWeights)) {
                SampledSpectrum value;
                if (visualizeStrategies)
                    value = misWeight == 0 ? SampledSpectrum(0.) : Lpath / misWeight;
                if (visualizeWeights)
                    value = Lpath;
                CHECK(pFilmNew.has_value());
                weightFilms[BufferIndex(s, t)].AddSplat(*pFilmNew, value, lambda);
            }
            if (t != 1)
                L += Lpath;
            else if (Lpath) {
                CHECK(pFilmNew.has_value());
                camera.GetFilm().AddSplat(*pFilmNew, Lpath, lambda);
            }
        }
    }

    return L;
}